

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

int __thiscall
vkt::memory::anon_unknown_0::MemoryTestInstance::verify
          (MemoryTestInstance *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ScopedLogSection log_00;
  bool bVar1;
  TestContext *this_00;
  TestLog *log_01;
  Context *context;
  MessageBuilder *this_01;
  Command *pCVar2;
  reference ppCVar3;
  undefined8 extraout_RAX;
  TestError *e;
  Command *command;
  size_t cmdNdx;
  undefined1 local_1e8 [8];
  VerifyContext verifyContext;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  ScopedLogSection local_28;
  ScopedLogSection section;
  TestLog *log;
  MemoryTestInstance *this_local;
  
  this_00 = vkt::Context::getTestContext((this->super_TestInstance).m_context);
  log_01 = tcu::TestContext::getLog(this_00);
  section.m_log = log_01;
  de::toString<unsigned_int>(&local_a8,&this->m_memoryTypeNdx);
  std::operator+(&local_88,"MemoryType",&local_a8);
  std::operator+(&local_68,&local_88,"Verify");
  de::toString<unsigned_long>(&local_d8,&this->m_iteration);
  std::operator+(&local_48,&local_68,&local_d8);
  de::toString<unsigned_int>(&local_158,&this->m_memoryTypeNdx);
  std::operator+(&local_138,"Memory type ",&local_158);
  std::operator+(&local_118,&local_138," verify iteration ");
  de::toString<unsigned_long>
            ((string *)&verifyContext.m_referenceImage.m_data.m_cap,&this->m_iteration);
  std::operator+(&local_f8,&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &verifyContext.m_referenceImage.m_data.m_cap);
  tcu::ScopedLogSection::ScopedLogSection(&local_28,log_01,&local_48,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&verifyContext.m_referenceImage.m_data.m_cap);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  log_00 = section;
  context = de::details::
            UniqueBase<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
            ::operator*(&(this->m_renderContext).
                         super_UniqueBase<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
                       );
  VerifyContext::VerifyContext
            ((VerifyContext *)local_1e8,log_00.m_log,&this->m_resultCollector,context,
             (this->m_config).size);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&cmdNdx,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)&cmdNdx,(char (*) [13])"Begin verify")
  ;
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&cmdNdx);
  command = (Command *)0x0;
  while( true ) {
    pCVar2 = (Command *)
             std::
             vector<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
             ::size(&this->m_commands);
    if (pCVar2 <= command) break;
    ppCVar3 = std::
              vector<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
              ::operator[](&this->m_commands,(size_type)command);
    (*(*ppCVar3)->_vptr_Command[7])(*ppCVar3,local_1e8,command);
    command = (Command *)((long)&command->_vptr_Command + 1);
  }
  bVar1 = nextIteration(this);
  VerifyContext::~VerifyContext((VerifyContext *)local_1e8);
  tcu::ScopedLogSection::~ScopedLogSection(&local_28);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar1);
}

Assistant:

bool MemoryTestInstance::verify (void)
{
	DE_ASSERT(!m_commands.empty());

	TestLog&					log				= m_context.getTestContext().getLog();
	const tcu::ScopedLogSection	section			(log, "MemoryType" + de::toString(m_memoryTypeNdx) + "Verify" + de::toString(m_iteration),
													  "Memory type " + de::toString(m_memoryTypeNdx) + " verify iteration " + de::toString(m_iteration));
	VerifyContext				verifyContext	(log, m_resultCollector, *m_renderContext, m_config.size);

	log << TestLog::Message << "Begin verify" << TestLog::EndMessage;

	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
	{
		Command& command = *m_commands[cmdNdx];

		try
		{
			command.verify(verifyContext, cmdNdx);
		}
		catch (const tcu::TestError& e)
		{
			m_resultCollector.fail(de::toString(cmdNdx) + ":" + command.getName() + " failed to verify, got exception: " + string(e.getMessage()));
			return nextIteration();
		}
	}

	return nextIteration();
}